

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-RingIndex.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1d88::RingIndexTest_RingIndex1_Test::~RingIndexTest_RingIndex1_Test
          (RingIndexTest_RingIndex1_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST( RingIndexTest, RingIndex1)
	{
		RingIndex ri(22, 23);
		EXPECT_EQ(++ri, 0);
		EXPECT_EQ(ri + 23, 0);
		EXPECT_EQ(ri + 24, 1);
		ri += 5;
		EXPECT_EQ(ri, 5);
		EXPECT_EQ(ri + RingIndex::LIMIT_MAX, ri + (RingIndex::LIMIT_MAX % ri.get_max()));
	}